

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfe.cpp
# Opt level: O2

string * to_string_abi_cxx11_(string *__return_storage_ptr__,TrackEncoding track_encoding)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch(track_encoding) {
  case ISOIBM_MFM_ENCODING:
    __s = "ISOIBM_MFM_ENCODING";
    __a = &local_9;
    break;
  case AMIGA_MFM_ENCODING:
    __s = "AMIGA_MFM_ENCODING";
    __a = &local_a;
    break;
  case ISOIBM_FM_ENCODING:
    __s = "ISOIBM_FM_ENCODING";
    __a = &local_b;
    break;
  case EMU_FM_ENCODING:
    __s = "EMU_FM_ENCODING";
    __a = &local_c;
    break;
  default:
    if (track_encoding == UNKNOWN_ENCODING) {
      __s = "UNKNOWN_ENCODING";
      __a = &local_d;
    }
    else {
      __s = "Unknown";
      __a = &local_e;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(TrackEncoding track_encoding)
{
    switch (track_encoding)
    {
    case ISOIBM_MFM_ENCODING:   return "ISOIBM_MFM_ENCODING";   break;
    case AMIGA_MFM_ENCODING:    return "AMIGA_MFM_ENCODING";    break;
    case ISOIBM_FM_ENCODING:    return "ISOIBM_FM_ENCODING";    break;
    case EMU_FM_ENCODING:       return "EMU_FM_ENCODING";       break;
    case UNKNOWN_ENCODING:      return "UNKNOWN_ENCODING";      break;
    }
    return "Unknown";
}